

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asio_service.cxx
# Opt level: O2

ptr<asio_service> nuraft::nuraft_global_mgr::get_asio_service(void)

{
  pthread_mutex_t *__mutex;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  element_type *in_RDI;
  ptr<asio_service> pVar2;
  
  __mutex = (pthread_mutex_t *)get_instance();
  if (__mutex == (pthread_mutex_t *)0x0) {
    (in_RDI->super_delayed_task_scheduler)._vptr_delayed_task_scheduler = (_func_int **)0x0;
    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&in_RDI->super_rpc_client_factory)->_M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    _Var1._M_pi = extraout_RDX;
  }
  else {
    std::mutex::lock((mutex *)&__mutex->__data);
    std::__shared_ptr<nuraft::asio_service,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<nuraft::asio_service,_(__gnu_cxx::_Lock_policy)2> *)in_RDI,
               (__shared_ptr<nuraft::asio_service,_(__gnu_cxx::_Lock_policy)2> *)&__mutex[1].__data)
    ;
    pthread_mutex_unlock(__mutex);
    _Var1._M_pi = extraout_RDX_00;
  }
  pVar2.super___shared_ptr<nuraft::asio_service,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var1._M_pi;
  pVar2.super___shared_ptr<nuraft::asio_service,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (ptr<asio_service>)
         pVar2.super___shared_ptr<nuraft::asio_service,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<asio_service> nuraft_global_mgr::get_asio_service() {
    // NOTE:
    //   Basic assumption is that this function is not called frequently,
    //   only once at the initialization time. Hence it is ok to acquire
    //   lock for a such read-only operation.
    nuraft_global_mgr* mgr = get_instance();
    if (!mgr) return nullptr;

    std::lock_guard<std::mutex> l(mgr->asio_service_lock_);
    return mgr->asio_service_;
}